

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

int envy_bios_parse_xpiodir(envy_bios *bios)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  envy_bios_xpio *peVar5;
  byte bVar6;
  uint uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  char *__format;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  uVar1 = (bios->gpio).xpiodir.offset;
  iVar3 = 0;
  if (uVar1 != 0) {
    uVar7 = bios->length;
    uVar4 = (uint)uVar1;
    if (uVar4 < uVar7) {
      (bios->gpio).xpiodir.version = bios->data[uVar4];
      iVar3 = 0;
    }
    else {
      (bios->gpio).xpiodir.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar4);
      uVar1 = (bios->gpio).xpiodir.offset;
      uVar7 = bios->length;
      iVar3 = -0xe;
    }
    uVar4 = (uint)uVar1;
    if ((uint)((ulong)uVar4 + 1) < uVar7) {
      (bios->gpio).xpiodir.hlen = bios->data[(ulong)uVar4 + 1];
      iVar10 = 0;
    }
    else {
      (bios->gpio).xpiodir.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = (uint)(bios->gpio).xpiodir.offset;
      uVar7 = bios->length;
      iVar10 = -0xe;
    }
    if ((uint)((ulong)uVar4 + 2) < uVar7) {
      (bios->gpio).xpiodir.entriesnum = bios->data[(ulong)uVar4 + 2];
      iVar9 = 0;
    }
    else {
      (bios->gpio).xpiodir.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = (uint)(bios->gpio).xpiodir.offset;
      uVar7 = bios->length;
      iVar9 = -0xe;
    }
    if ((uint)((ulong)uVar4 + 3) < uVar7) {
      bVar6 = bios->data[(ulong)uVar4 + 3];
      (bios->gpio).xpiodir.rlen = bVar6;
      iVar12 = 0;
    }
    else {
      (bios->gpio).xpiodir.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar4 = (uint)(bios->gpio).xpiodir.offset;
      bVar6 = (bios->gpio).xpiodir.rlen;
      iVar12 = -0xe;
    }
    envy_bios_block(bios,uVar4,
                    (uint)(bios->gpio).xpiodir.entriesnum * (uint)bVar6 +
                    (uint)(bios->gpio).xpiodir.hlen,"XPIODIR",-1);
    if (((iVar10 == 0 && iVar3 == 0) && iVar9 == 0) && iVar12 == 0) {
      bVar6 = (bios->gpio).xpiodir.version;
      if (bVar6 != ((bios->gpio).version & 0xf0)) {
        fwrite("XPIODIR version mismatch with GPIO\n",0x23,1,_stderr);
        bVar6 = (bios->gpio).xpiodir.version;
      }
      if ((bVar6 == 0x40) || (bVar6 == 0x30)) {
        bVar6 = (bios->gpio).xpiodir.hlen;
        uVar13 = (ulong)bVar6;
        if (bVar6 < 4) {
          __format = "XPIODIR table header too short [%d < %d]\n";
          uVar8 = 4;
        }
        else {
          bVar2 = (bios->gpio).xpiodir.rlen;
          if (1 < bVar2) {
            if (bVar6 != 4) {
              fprintf(_stderr,"XPIODIR table header longer than expected [%d > %d]\n",uVar13,4);
              bVar2 = (bios->gpio).xpiodir.rlen;
            }
            if (2 < bVar2) {
              envy_bios_parse_xpiodir_cold_1();
            }
            bVar6 = (bios->gpio).xpiodir.entriesnum;
            peVar5 = (envy_bios_xpio *)calloc((ulong)bVar6,0x18);
            (bios->gpio).xpiodir.entries = peVar5;
            if (peVar5 == (envy_bios_xpio *)0x0) {
              return -0xc;
            }
            if (bVar6 != 0) {
              lVar11 = 0;
              uVar13 = 0;
              do {
                uVar7 = (uint)(bios->gpio).xpiodir.rlen * (int)uVar13 +
                        (uint)(bios->gpio).xpiodir.hlen + *(int *)&(bios->gpio).xpiodir;
                peVar5 = (bios->gpio).xpiodir.entries;
                if (bios->length <= (uVar7 & 0xffff) + 1) {
                  *(undefined2 *)((long)&peVar5->offset + lVar11) = 0;
                  fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
                  goto LAB_00259b0f;
                }
                peVar5 = (envy_bios_xpio *)((long)&peVar5->offset + lVar11);
                peVar5->offset = *(uint16_t *)(bios->data + (ushort)uVar7);
                iVar3 = envy_bios_parse_xpio(bios,peVar5,(int)uVar13);
                if (iVar3 != 0) {
                  envy_bios_parse_xpiodir_cold_2();
                }
                uVar13 = uVar13 + 1;
                lVar11 = lVar11 + 0x18;
              } while (uVar13 < (bios->gpio).xpiodir.entriesnum);
            }
            (bios->gpio).xpiodir.valid = '\x01';
            return 0;
          }
          __format = "XPIODIR table record too short [%d < %d]\n";
          uVar13 = (ulong)(uint)bVar2;
          uVar8 = 2;
        }
        fprintf(_stderr,__format,uVar13,uVar8);
      }
      else {
        envy_bios_parse_xpiodir_cold_3();
      }
      iVar3 = -0x16;
    }
    else {
LAB_00259b0f:
      iVar3 = -0xe;
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_xpiodir (struct envy_bios *bios) {
	struct envy_bios_xpiodir *xpiodir = &bios->gpio.xpiodir;
	int err = 0;
	if (!xpiodir->offset)
		return 0;
	err |= bios_u8(bios, xpiodir->offset, &xpiodir->version);
	err |= bios_u8(bios, xpiodir->offset+1, &xpiodir->hlen);
	err |= bios_u8(bios, xpiodir->offset+2, &xpiodir->entriesnum);
	err |= bios_u8(bios, xpiodir->offset+3, &xpiodir->rlen);
	envy_bios_block(bios, xpiodir->offset, xpiodir->hlen + xpiodir->rlen * xpiodir->entriesnum, "XPIODIR", -1);
	if (err)
		return -EFAULT;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpiodir->version != (bios->gpio.version & 0xf0))
		ENVY_BIOS_WARN("XPIODIR version mismatch with GPIO\n");
	switch (xpiodir->version) {
		case 0x30:
		case 0x40:
			wanthlen = 4;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIODIR table version %d.%d\n", xpiodir->version >> 4, xpiodir->version & 0xf);
			return -EINVAL;
	}
	if (xpiodir->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIODIR table header too short [%d < %d]\n", xpiodir->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpiodir->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIODIR table record too short [%d < %d]\n", xpiodir->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpiodir->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIODIR table header longer than expected [%d > %d]\n", xpiodir->hlen, wanthlen);
	}
	if (xpiodir->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIODIR table record longer than expected [%d > %d]\n", xpiodir->rlen, wantrlen);
	}
	xpiodir->entries = calloc(xpiodir->entriesnum, sizeof *xpiodir->entries);
	if (!xpiodir->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpiodir->entriesnum; i++) {
		uint16_t eoff = xpiodir->offset + xpiodir->hlen + xpiodir->rlen * i;
		struct envy_bios_xpio *xpio = &xpiodir->entries[i];
		err |= bios_u16(bios, eoff, &xpio->offset);
		if (err)
			return -EFAULT;
		if (envy_bios_parse_xpio(bios, xpio, i))
			ENVY_BIOS_ERR("Failed to parse XPIO table at 0x%04x version %d.%d\n", xpio->offset, xpio->version >> 4, xpio->version & 0xf);
	}
	xpiodir->valid = 1;
	return 0;
}